

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

void throwit(obj *obj,obj *ostack,long wep_mask,boolean twoweap,schar dx,schar dy,schar dz)

{
  undefined1 *puVar1;
  byte bVar2;
  short sVar3;
  ulong uVar4;
  char cVar5;
  boolean bVar6;
  schar sVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  obj *poVar12;
  monst *pmVar13;
  char *pcVar14;
  char *pcVar15;
  undefined7 in_register_00000009;
  uint uVar16;
  int *piVar17;
  char *pcVar18;
  uint uVar19;
  char *pcVar20;
  bool bVar21;
  obj *in_stack_ffffffffffffff88;
  uint local_5c;
  int local_58;
  boolean obj_destroyed;
  int local_50;
  undefined4 local_4c;
  obj *local_48;
  int dmg;
  d_level *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,twoweap);
  bVar21 = true;
  local_48 = ostack;
  local_38 = (d_level *)wep_mask;
  if ((u.umonnum != 0x9e && (u.uprops[0x1b].intrinsic == 0 && u.uprops[0x1c].intrinsic == 0)) &&
     ((youmonst.data)->mlet != '\x1c')) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017cd6a;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017cd65;
LAB_0017cd85:
      if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_0017cdae:
        bVar21 = u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0;
      }
      else if (u.umonnum != u.umonster) {
        poVar12 = (obj *)0x24;
        bVar6 = dmgtype(youmonst.data,0x24);
        ostack = poVar12;
        if (bVar6 != '\0') goto LAB_0017cdae;
      }
    }
    else {
LAB_0017cd65:
      if (ublindf != (obj *)0x0) {
LAB_0017cd6a:
        if (ublindf->oartifact == '\x1d') goto LAB_0017cd85;
      }
    }
  }
  iVar10 = (int)ostack;
  uVar11 = *(uint *)&obj->field_0x4a;
  uVar8 = uVar11 | 0x2000000;
  *(uint *)&obj->field_0x4a = uVar8;
  if ((uVar11 & 1) == 0) {
LAB_0017cdea:
    if ((((uVar8 >> 0x14 & 1) != 0) && (iVar9 = rnf(7,iVar10), iVar9 != 0)) ||
       ((iVar9 = weapon_type(obj), u.weapon_skills[iVar9].skill == '\0' &&
        (iVar10 = rnf(5,iVar10), iVar10 != 0)))) goto LAB_0017ce25;
  }
  else {
    iVar9 = rnf(7,iVar10);
    if (iVar9 == 0) {
      uVar8 = *(uint *)&obj->field_0x4a;
      goto LAB_0017cdea;
    }
LAB_0017ce25:
    if (u.dy != '\0' || u.dx != '\0') {
      if ((obj->oclass == '\r') || (obj->oclass == '\x02')) {
        cVar5 = objects[obj->otyp].oc_subtyp;
        if ((cVar5 < -0x18) ||
           ((uwep == (obj *)0x0 || -0x16 < cVar5 ||
            ((int)cVar5 + (int)objects[uwep->otyp].oc_subtyp != 0)))) goto LAB_0017cea1;
        pcVar20 = "%s!";
        pcVar18 = "misfire";
      }
      else {
LAB_0017cea1:
        pcVar20 = "%s as you throw it!";
        pcVar18 = "slip";
        if (((obj->field_0x4c & 0x10) == 0) && (bVar6 = throwing_weapon(obj), bVar6 == '\0'))
        goto LAB_0017cf2b;
      }
      pcVar18 = Tobjnam(obj,pcVar18);
      iVar10 = (int)pcVar18;
      pline(pcVar20);
      uVar11 = mt_random();
      dx = (char)((ulong)uVar11 % 3) + -1;
      uVar11 = mt_random();
      dy = (char)((ulong)uVar11 % 3) + -1;
      bVar21 = true;
      if (dx == '\0' && dy == '\0') {
        iVar10 = rnf(3,iVar10);
        dz = -(iVar10 != 0) | 1;
        dx = '\0';
        dy = '\0';
      }
    }
  }
LAB_0017cf2b:
  if (dz < '\x01' || (dx != '\0' || dy != '\0')) {
    iVar10 = calc_capacity(obj->owt);
    if (1 < iVar10) {
      if (u.umonnum == u.umonster) {
        if ((u.uhp < 10) && (iVar10 = u.uhp, u.uhp != u.uhpmax)) {
LAB_0017d317:
          if (((uint)(iVar10 * 2) < obj->owt) &&
             (bVar6 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar6 == '\0')) {
            pcVar18 = xname(obj);
            the(pcVar18);
            pline("You have so little stamina, %s drops from your grasp.");
            exercise(4,'\0');
            dz = 1;
            goto LAB_0017cf7e;
          }
        }
      }
      else if ((u.mh < 5) && (iVar10 = u.mh, u.mh != u.mhmax)) goto LAB_0017d317;
    }
  }
  else {
LAB_0017cf7e:
    dx = '\0';
    dy = '\0';
  }
  local_50 = (int)dx;
  iVar10 = (int)dy;
  thrownobj = obj;
  if ((u._1052_1_ & 1) == 0) {
    if (dz != 0) {
      if ((dz < '\0') && (urole.malenum == 0x167)) {
        if ((obj->oartifact == '\x05') && (!bVar21)) {
          pcVar18 = Tobjnam(obj,"hit");
          pcVar20 = ceiling((int)u.ux,(int)u.uy);
          pline("%s the %s and returns to your hand!",pcVar18,pcVar20);
          poVar12 = addinv(in_stack_ffffffffffffff88);
          encumber_msg();
          setuwep(poVar12);
LAB_0017d037:
          u.twoweap = (boolean)local_4c;
          thrownobj = (obj *)0x0;
          return;
        }
      }
      else if (-1 < dz) goto LAB_0017d2d0;
      bVar6 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar6 != '\0') || ((u._1052_1_ & 2) != 0)) ||
         (bVar6 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar6 != '\0')) {
LAB_0017d2d0:
        hitfloor(obj,local_48,'\x01');
        thrownobj = (obj *)0x0;
        return;
      }
      uVar11 = mt_random();
      if (uVar11 % 5 == 0) {
        pcVar18 = " almost";
      }
      else {
        bVar6 = breaktest(obj);
        if (bVar6 != '\0') {
          pcVar18 = Doname2(obj);
          pcVar20 = ceiling((int)u.ux,(int)u.uy);
          pline("%s hits the %s.",pcVar18,pcVar20);
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
              bVar21 = true;
              if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0017de86;
              goto LAB_0017d8c4;
            }
          }
          else {
LAB_0017d8c4:
            if (ublindf == (obj *)0x0) {
              bVar21 = false;
              goto LAB_0017de86;
            }
          }
          bVar21 = ublindf->oartifact == '\x1d';
LAB_0017de86:
          breakmsg(obj,bVar21);
          breakobj(obj,u.ux,u.uy,'\x01','\x01');
          thrownobj = (obj *)0x0;
          return;
        }
        pcVar18 = "";
      }
      pcVar20 = Doname2(obj);
      pcVar14 = ceiling((int)u.ux,(int)u.uy);
      pcVar15 = body_part(8);
      pline("%s%s hits the %s, then falls back on top of your %s.",pcVar20,pcVar18,pcVar14,pcVar15);
      if (obj->oclass == '\b') {
        potionhit(&youmonst,obj,'\x01');
        thrownobj = (obj *)0x0;
        return;
      }
      bVar6 = breaktest(obj);
      if (bVar6 == '\0') {
        if (uarmh == (obj *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (ushort)((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7;
        }
        local_5c = dmgval((monst *)0x0,obj,'\x01',&youmonst);
        if (local_5c == 0) {
          uVar11 = obj->owt;
          local_5c = (int)uVar11 / 100;
          if ((int)uVar11 < 100) {
            local_5c = 1;
          }
          else if (699 < uVar11) {
            local_5c = 6;
          }
          if ((youmonst.data != mons + 299) ||
             ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xe0)) goto LAB_0017e07b;
          local_5c = 0;
        }
        else {
LAB_0017e07b:
          if (bVar21 && 1 < (int)local_5c) {
            local_5c = 1;
          }
        }
        uVar11 = mt_random();
        bVar6 = artifact_hit((monst *)0x0,&youmonst,obj,local_48,'\x01',(int *)&local_5c,
                             uVar11 % 0x12 + 2);
        if (0 < (int)local_5c) {
          local_5c = local_5c + (int)u.udaminc;
        }
        if ((int)local_5c < 0) {
          local_5c = 0;
        }
        if (u.uprops[0x33].extrinsic != 0 || u.uprops[0x33].intrinsic != 0) {
          local_5c = local_5c + 1 >> 1;
        }
        if (uarmh != (obj *)0x0) {
          if (bVar21) {
            piVar17 = &u.mh;
            if (u.umonnum == u.umonster) {
              piVar17 = &u.uhp;
            }
            if ((int)local_5c < *piVar17) {
              if (bVar6 == '\0') {
                pline("Fortunately, you are wearing a hard helmet.");
              }
              goto LAB_0017e1d5;
            }
          }
          if ((flags.verbose != '\0') && ((obj->otyp != 0x10e || (1 < obj->corpsenm - 0xbU)))) {
            pcVar18 = xname(uarmh);
            pline("Your %s does not protect you.",pcVar18);
          }
LAB_0017e1d5:
          hitfloor(obj,local_48,'\x01');
          losehp(local_5c,"falling object",0);
          thrownobj = (obj *)0x0;
          return;
        }
        if ((obj->otyp != 0x10e) ||
           (((((obj->corpsenm != 0xc && (obj->corpsenm != 0xb)) || (u.uprops[8].extrinsic != 0)) ||
             (((byte)youmonst.mintrinsics & 0x80) != 0)) ||
            ((bVar6 = poly_when_stoned(youmonst.data), bVar6 != '\0' &&
             (iVar10 = polymon(0x108), iVar10 != 0)))))) goto LAB_0017e1d5;
LAB_0017e2cd:
        if (u.uprops[0x21].intrinsic == 0) {
          pline("You begin turn into stone!");
        }
        delayed_petrify((char *)0x0,"elementary physics");
        if (obj == (obj *)0x0) {
          thrownobj = (obj *)0x0;
          return;
        }
        goto LAB_0017dc8c;
      }
      sVar3 = obj->otyp;
      iVar10 = obj->corpsenm;
      if (((sVar3 == 0x218) || (uVar11 = 0, sVar3 == 0x120)) &&
         (bVar6 = can_blnd(&youmonst,&youmonst,0xfe,obj), uVar11 = 0, bVar6 != '\0')) {
        uVar11 = rnd(0x19);
      }
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017dd87;
        bVar21 = true;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017dd7e;
      }
      else {
LAB_0017dd7e:
        if (ublindf == (obj *)0x0) {
          bVar21 = false;
        }
        else {
LAB_0017dd87:
          bVar21 = ublindf->oartifact == '\x1d';
        }
      }
      breakmsg(obj,bVar21);
      breakobj(obj,u.ux,u.uy,'\x01','\x01');
      if ((sVar3 != 0x218) && (sVar3 != 0x120)) {
        if (sVar3 != 0x10f) {
          thrownobj = (obj *)0x0;
          return;
        }
        if ((((iVar10 == 0xc) || (iVar10 == 0xb)) && (uarmh == (obj *)0x0)) &&
           (((u.uprops[8].extrinsic == 0 && (((byte)youmonst.mintrinsics & 0x80) == 0)) &&
            ((bVar6 = poly_when_stoned(youmonst.data), bVar6 == '\0' ||
             (iVar10 = polymon(0x108), iVar10 == 0)))))) {
          obj = (obj *)0x0;
          goto LAB_0017e2cd;
        }
      }
      body_part(2);
      pline("You\'ve got it all over your %s!");
      if (uVar11 == 0) {
        thrownobj = (obj *)0x0;
        return;
      }
      if (sVar3 == 0x218) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017dfca;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017dfc1;
LAB_0017e222:
          pline("It blinds you!");
        }
        else {
LAB_0017dfc1:
          if (ublindf != (obj *)0x0) {
LAB_0017dfca:
            if (ublindf->oartifact == '\x1d') goto LAB_0017e222;
          }
        }
      }
      u.ucreamed = u.ucreamed + uVar11;
      make_blinded((ulong)uVar11 + (ulong)u.uprops[0x1e].intrinsic,'\0');
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0017e2ae;
          goto LAB_0017e256;
        }
      }
      else {
LAB_0017e256:
        if (ublindf == (obj *)0x0) goto LAB_0017e261;
      }
      if (ublindf->oartifact == '\x1d') {
LAB_0017e2ae:
        pline("Your vision quickly clears.");
        thrownobj = (obj *)0x0;
        return;
      }
LAB_0017e261:
      if (flags.verbose == '\0') {
        thrownobj = (obj *)0x0;
        return;
      }
      pcVar18 = body_part(2);
      pline("Use the command #wipe to clean your %s.",pcVar18);
      thrownobj = (obj *)0x0;
      return;
    }
    if (((u._1052_1_ & 2) == 0) && (obj->otyp == 9)) {
      local_58 = iVar10;
      bVar6 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar6 != '\0') || (u.uprops[0x12].intrinsic != 0)) ||
         ((u.uprops[0x12].extrinsic != 0 ||
          (iVar10 = local_50, iVar9 = local_58, (youmonst.data)->mlet == '\x05')))) {
        hurtle(-(int)dx,-(int)dy,1,'\x01');
        iVar10 = (int)dx;
        iVar9 = (int)dy;
      }
      pmVar13 = boomhit(iVar10,iVar9);
      if (pmVar13 == &youmonst) {
        exercise(3,'\x01');
        poVar12 = addinv(in_stack_ffffffffffffff88);
        encumber_msg();
        if (local_38 == (d_level *)0x0) {
          thrownobj = (obj *)0x0;
          return;
        }
        if (((long)poVar12->owornmask & (ulong)local_38) != 0) {
          thrownobj = (obj *)0x0;
          return;
        }
        setworn(poVar12,(long)local_38);
        goto LAB_0017d037;
      }
    }
    else {
      uVar11 = 1;
      local_58 = iVar10;
      sVar7 = acurrstr();
      uVar8 = (uint)(sVar7 / '\x02');
      uVar4 = 0x28;
      if ((long)obj->otyp == 0x216) {
        uVar4 = 100;
      }
      uVar16 = uVar8 - (int)(obj->owt / uVar4);
      uVar19 = uVar16;
      if (((uball == obj) && (uVar19 = uVar11, u.ustuck == (monst *)0x0)) &&
         (uVar19 = 5, (int)uVar16 < 5)) {
        uVar19 = uVar16;
      }
      if ((int)uVar19 < 2) {
        uVar19 = uVar11;
      }
      cVar5 = obj->oclass;
      if (((cVar5 == '\r') || (cVar5 == '\x02')) &&
         ((byte)(objects[obj->otyp].oc_subtyp + 0x18U) < 3)) {
        if (((cVar5 == '\r') || (cVar5 == '\x02')) &&
           ((uwep != (obj *)0x0 &&
            ((int)objects[obj->otyp].oc_subtyp + (int)objects[uwep->otyp].oc_subtyp == 0)))) {
          uVar19 = uVar19 + 1;
        }
        else {
          uVar19 = uVar19 >> (cVar5 != '\r');
        }
      }
      local_38 = &u.uz;
      bVar6 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if ((((bVar6 != '\0') || (u.uprops[0x12].intrinsic != 0)) || (u.uprops[0x12].extrinsic != 0))
         || (uVar16 = uVar19, (youmonst.data)->mlet == '\x05')) {
        uVar8 = uVar8 - uVar19;
        if ((int)uVar8 < 2) {
          uVar8 = uVar11;
        }
        uVar16 = uVar19 - uVar8;
        if ((int)(uVar19 - uVar8) < 2) {
          uVar16 = uVar11;
        }
      }
      if (obj->otyp == 0x214) {
        uVar16 = 0x14;
      }
      else if (obj->oartifact == '\x05') {
        uVar16 = uVar16 + 1 >> 1;
      }
      else {
        uVar19 = uVar16;
        if (u.utraptype == 4) {
          uVar19 = uVar11;
        }
        if (u.utrap == 0) {
          uVar19 = uVar16;
        }
        if (uball == obj) {
          uVar16 = uVar19;
        }
      }
      if ((u._1052_1_ & 2) != 0) {
        uVar16 = uVar11;
      }
      obj_destroyed = '\0';
      in_stack_ffffffffffffff88 = obj;
      pmVar13 = beam_hit(local_50,local_58,uVar16,1,(_func_int_monst_ptr_obj_ptr *)0x0,
                         (_func_int_obj_ptr_obj_ptr *)0x0,obj,&obj_destroyed);
      bVar6 = on_level(local_38,&dungeon_topology.d_air_level);
      if (((bVar6 != '\0') || (u.uprops[0x12].intrinsic != 0)) ||
         ((u.uprops[0x12].extrinsic != 0 || ((youmonst.data)->mlet == '\x05')))) {
        hurtle(-local_50,-local_58,uVar8,'\x01');
      }
      if (obj_destroyed != '\0') {
        return;
      }
    }
    if (pmVar13 != (monst *)0x0) goto LAB_0017d066;
    pmVar13 = (monst *)0x0;
  }
  else {
    bhitpos.x = (u.ustuck)->mx;
    bhitpos.y = (u.ustuck)->my;
    pmVar13 = u.ustuck;
    local_58 = iVar10;
LAB_0017d066:
    if ((((pmVar13->field_0x63 & 2) != 0) && (obj->where == '\x04')) &&
       ((monst *)(obj->v).v_nexthere == pmVar13)) {
      thrownobj = (obj *)0x0;
      return;
    }
    snuff_candle(obj);
    notonhead = true;
    if (bhitpos.x == pmVar13->mx) {
      notonhead = bhitpos.y != pmVar13->my;
    }
    iVar10 = thitmonst(pmVar13,obj,local_48);
    pmVar13 = level->monsters[bhitpos.x][bhitpos.y];
    if ((pmVar13 == (monst *)0x0) || ((*(uint *)&pmVar13->field_0x60 >> 9 & 1) != 0)) {
      pmVar13 = (monst *)0x0;
    }
    else if ((*(uint *)&pmVar13->field_0x60 >> 0x19 & 1) != 0) {
      cVar5 = inside_shop(level,u.ux,u.uy);
      if (cVar5 != '\0') {
        pcVar18 = in_rooms(level,pmVar13->mx,pmVar13->my,0x12);
        pcVar18 = strchr(pcVar18,(int)u.ushops[0]);
        if (pcVar18 != (char *)0x0) goto LAB_0017d14b;
      }
      hot_pursuit(pmVar13);
    }
LAB_0017d14b:
    if (iVar10 != 0) {
      return;
    }
  }
  if ((u._1052_1_ & 1) != 0) {
    if (uball != obj) {
      mpickobj(u.ustuck,obj);
      return;
    }
    return;
  }
  if (((obj->oartifact != '\x05') || (urole.malenum != 0x167)) ||
     (uVar11 = mt_random(), uVar11 % 100 == 0)) {
    bVar2 = level->locations[bhitpos.x][bhitpos.y].typ;
    if ((1 < (byte)(bVar2 - 0x25)) &&
       (((0x23 < bVar2 || ((0x8001e0000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) == 0)) &&
        (bVar6 = breaktest(obj), bVar6 != '\0')))) {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar6 = dmgtype(youmonst.data,0x24), bVar6 != '\0')))) {
        iVar10 = (int)obj->otyp;
      }
      else {
        iVar10 = display_rng(0x219);
        iVar10 = iVar10 + 1;
      }
      tmp_at(-4,iVar10 + 1);
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
      tmp_at(-6,0);
      breakmsg(obj,viz_array[bhitpos.y][bhitpos.x] & 2);
      breakobj(obj,bhitpos.x,bhitpos.y,'\x01','\x01');
      return;
    }
    bVar6 = flooreffects(obj,(int)bhitpos.x,(int)bhitpos.y,"fall");
    if (bVar6 != '\0') {
      return;
    }
    obj_no_longer_held(obj);
    bVar6 = detonate_obj(obj,local_48,uwep,(int)bhitpos.x,(int)bhitpos.y,'\x01');
    if (bVar6 != '\0') {
      return;
    }
    if (pmVar13 == (monst *)0x0) {
      snuff_candle(obj);
      bVar6 = ship_object(obj,bhitpos.x,bhitpos.y,'\0');
      if (bVar6 != '\0') {
        thrownobj = (obj *)0x0;
        return;
      }
    }
    else {
      if ((((pmVar13->field_0x63 & 2) != 0) && ((byte)(obj->oclass | 4U) == 6)) &&
         (objects[obj->otyp].oc_subtyp == '\x04')) {
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
          pcVar18 = Monnam(pmVar13);
          pcVar20 = xname(obj);
          pcVar20 = the(pcVar20);
          pline("%s snatches up %s.",pcVar18,pcVar20);
        }
        if (u.ushops[0] != '\0') {
          check_shop_obj(obj,bhitpos.x,bhitpos.y,'\0');
        }
        mpickobj(pmVar13,obj);
        thrownobj = (obj *)0x0;
        return;
      }
      snuff_candle(obj);
    }
    thrownobj = (obj *)0x0;
    place_object(obj,level,(int)bhitpos.x,(int)bhitpos.y);
    if ((u.ushops[0] != '\0') && (uball != obj)) {
      check_shop_obj(obj,bhitpos.x,bhitpos.y,'\0');
    }
    stackobj(in_stack_ffffffffffffff88);
    if (uball == obj) {
      drop_ball(bhitpos.x,bhitpos.y,(schar)local_50,(schar)local_58);
    }
    if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
      newsym((int)bhitpos.x,(int)bhitpos.y);
    }
    bVar6 = obj_sheds_light(obj);
    if (bVar6 != '\0') {
      vision_full_recalc = '\x01';
    }
    puVar1 = &level->locations[bhitpos.x][bhitpos.y].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffb;
    bVar2 = level->locations[bhitpos.x][bhitpos.y].typ;
    if (1 < (byte)(bVar2 - 0x25)) {
      if ((bVar2 < 0x24) && ((0x8001e0000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) {
        return;
      }
      container_impact_dmg(obj);
      return;
    }
    return;
  }
  sho_obj_return_to_u(obj,(schar)local_50,(schar)local_58);
  if ((!bVar21) && (uVar11 = mt_random(), uVar11 % 100 != 0)) {
    pcVar18 = Tobjnam(obj,"return");
    pline("%s to your hand!",pcVar18);
    poVar12 = addinv(in_stack_ffffffffffffff88);
    encumber_msg();
    setuwep(poVar12);
    u.twoweap = (boolean)local_4c;
    if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
      thrownobj = (obj *)0x0;
      return;
    }
    newsym((int)bhitpos.x,(int)bhitpos.y);
    thrownobj = (obj *)0x0;
    return;
  }
  uVar11 = mt_random();
  uVar8 = uVar11 & 1;
  dmg = uVar8;
  if ((uVar11 & 1) == 0) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017d1ef;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017d1e6;
      pcVar18 = "%s back to you, landing %s your %s.";
LAB_0017daf0:
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017db13;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017db0e;
LAB_0017db19:
      pcVar20 = Tobjnam(obj,"return");
    }
    else {
LAB_0017d1e6:
      if (ublindf == (obj *)0x0) {
        pcVar18 = "%s lands %s your %s.";
      }
      else {
LAB_0017d1ef:
        pcVar18 = "%s lands %s your %s.";
        if (ublindf->oartifact == '\x1d') {
          pcVar18 = "%s back to you, landing %s your %s.";
        }
      }
      if (u.uprops[0x1e].intrinsic == 0) goto LAB_0017daf0;
LAB_0017db0e:
      if (ublindf != (obj *)0x0) {
LAB_0017db13:
        if (ublindf->oartifact == '\x1d') goto LAB_0017db19;
      }
      pcVar20 = "Something";
    }
    if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
      pcVar14 = "at";
      if ((youmonst.data)->mlet == '\x05') {
        pcVar14 = "beneath";
      }
    }
    else {
      pcVar14 = "beneath";
    }
    pcVar15 = body_part(5);
    makeplural(pcVar15);
    pline(pcVar18,pcVar20,pcVar14);
  }
  else {
    iVar10 = rnd(3);
    dmg = uVar8 + iVar10;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017d7b2;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017d7a9;
      pcVar18 = "%s back toward you, hitting your %s!";
LAB_0017dba6:
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017dbd2;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017dbcd;
      pcVar20 = "fly";
    }
    else {
LAB_0017d7a9:
      if (ublindf == (obj *)0x0) {
        pcVar18 = "%s your %s!";
      }
      else {
LAB_0017d7b2:
        pcVar18 = "%s your %s!";
        if (ublindf->oartifact == '\x1d') {
          pcVar18 = "%s back toward you, hitting your %s!";
        }
      }
      if (u.uprops[0x1e].intrinsic == 0) goto LAB_0017dba6;
LAB_0017dbcd:
      if (ublindf == (obj *)0x0) {
        pcVar20 = "hit";
      }
      else {
LAB_0017dbd2:
        pcVar20 = "hit";
        if (ublindf->oartifact == '\x1d') {
          pcVar20 = "fly";
        }
      }
    }
    pcVar20 = Tobjnam(obj,pcVar20);
    pcVar14 = body_part(0);
    pline(pcVar18,pcVar20,pcVar14);
    artifact_hit((monst *)0x0,&youmonst,obj,local_48,'\x01',&dmg,0);
    iVar10 = dmg;
    pcVar18 = xname(obj);
    bVar6 = obj_is_pname(obj);
    losehp(iVar10,pcVar18,(uint)(bVar6 != '\0'));
  }
  bVar6 = ship_object(obj,u.ux,u.uy,'\0');
  if (bVar6 != '\0') {
    thrownobj = (obj *)0x0;
    return;
  }
LAB_0017dc8c:
  dropy(obj);
  thrownobj = (obj *)0x0;
  return;
}

Assistant:

void throwit(struct obj *obj,
	     struct obj *ostack,
	     long wep_mask,  /* used to re-equip returning boomerang */
	     boolean twoweap, /* used to restore twoweapon mode if wielded weapon returns */
	     schar dx, schar dy, schar dz)
{
	struct monst *mon;
	int range, urange;
	boolean impaired = (Confusion || Stunned || Blind ||
			   Hallucination || Fumbling);

	obj->was_thrown = 1;
	/* Split slip chance of cursed and greased objects; one that is both
	 * has a 1-(6/7)^2 (or 13/49, or ~26%) chance of slipping.
	 * Also, restricted throwing has a 20% chance of slipping
	 * to discourage role-/race-atypical fighting.
	 */
	if (((obj->cursed && rnf(1,7)) ||
	     (obj->greased && rnf(1,7)) ||
	     (P_SKILL(weapon_type(obj)) == P_ISRESTRICTED && rnf(1,5))) &&
	    (u.dx || u.dy)) {
	    boolean slipok = TRUE;
	    if (ammo_and_launcher(obj, uwep))
		pline("%s!", Tobjnam(obj, "misfire"));
	    else {
		/* only slip if it's greased or meant to be thrown */
		if (obj->greased || throwing_weapon(obj))
		    /* BUG: this message is grammatically incorrect if obj has
		       a plural name; greased gloves or boots for instance. */
		    pline("%s as you throw it!", Tobjnam(obj, "slip"));
		else slipok = FALSE;
	    }
	    if (slipok) {
		dx = rn2(3)-1;
		dy = rn2(3)-1;
		if (!dx && !dy)
		    dz = rnf(1,3) ? -1 : 1;
		impaired = TRUE;
	    }
	}

	if ((dx || dy || (dz < 1)) &&
	    calc_capacity((int)obj->owt) > SLT_ENCUMBER &&
	    (Upolyd ? (u.mh < 5 && u.mh != u.mhmax)
	     : (u.uhp < 10 && u.uhp != u.uhpmax)) &&
	    obj->owt > (unsigned)((Upolyd ? u.mh : u.uhp) * 2) &&
	    !Is_airlevel(&u.uz)) {
	    pline("You have so little stamina, %s drops from your grasp.",
		the(xname(obj)));
	    exercise(A_CON, FALSE);
	    dx = dy = 0;
	    dz = 1;
	}

	thrownobj = obj;

	if (u.uswallow) {
		mon = u.ustuck;
		bhitpos.x = mon->mx;
		bhitpos.y = mon->my;
	} else if (dz) {
	    if (dz < 0 && Role_if (PM_VALKYRIE) &&
		    obj->oartifact == ART_MJOLLNIR && !impaired) {
		pline("%s the %s and returns to your hand!",
		      Tobjnam(obj, "hit"), ceiling(u.ux,u.uy));
		obj = addinv(obj);
		encumber_msg();
		setuwep(obj);
		u.twoweap = twoweap;
	    } else if (dz < 0 && !Is_airlevel(&u.uz) &&
		    !Underwater && !Is_waterlevel(&u.uz)) {
		toss_up(obj, ostack, rn2(5));
	    } else {
		hitfloor(obj, ostack, TRUE);
	    }
	    thrownobj = NULL;
	    return;

	} else if (obj->otyp == BOOMERANG && !Underwater) {
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, 1, TRUE);
		mon = boomhit(dx, dy);
		if (mon == &youmonst) {		/* the thing was caught */
			exercise(A_DEX, TRUE);
			obj = addinv(obj);
			encumber_msg();
			if (wep_mask && !(obj->owornmask & wep_mask)) {
			    setworn(obj, wep_mask);
			    u.twoweap = twoweap;
			}
			thrownobj = NULL;
			return;
		}
	} else {
		boolean obj_destroyed;
		urange = (int)(ACURRSTR)/2;
		/* balls are easy to throw or at least roll */
		/* also, this insures the maximum range of a ball is greater
		 * than 1, so the effects from throwing attached balls are
		 * actually possible
		 */
		if (obj->otyp == HEAVY_IRON_BALL)
			range = urange - (int)(obj->owt/100);
		else
			range = urange - (int)(obj->owt/40);
		if (obj == uball) {
			if (u.ustuck) range = 1;
			else if (range >= 5) range = 5;
		}
		if (range < 1) range = 1;

		if (is_ammo(obj)) {
		    if (ammo_and_launcher(obj, uwep))
			range++;
		    else if (obj->oclass != GEM_CLASS)
			range /= 2;
		}

		if (Is_airlevel(&u.uz) || Levitation) {
		    /* action, reaction... */
		    urange -= range;
		    if (urange < 1) urange = 1;
		    range -= urange;
		    if (range < 1) range = 1;
		}

		if (obj->otyp == BOULDER)
		    range = 20;		/* you must be giant */
		else if (obj->oartifact == ART_MJOLLNIR)
		    range = (range + 1) / 2;	/* it's heavy */
		else if (obj == uball && u.utrap && u.utraptype == TT_INFLOOR)
		    range = 1;

		if (Underwater) range = 1;
		
		obj_destroyed = FALSE;
		mon = beam_hit(dx, dy, range, THROWN_WEAPON, NULL, NULL, obj,
			       &obj_destroyed);

		/* have to do this after bhit() so u.ux & u.uy are correct */
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, urange, TRUE);
		
		if (obj_destroyed) return;
	}

	if (mon) {
		boolean obj_gone;

		if (mon->isshk &&
		    obj->where == OBJ_MINVENT && obj->ocarry == mon) {
		    thrownobj = NULL;
		    return;		/* alert shk caught it */
		}
		snuff_candle(obj);
		notonhead = (bhitpos.x != mon->mx || bhitpos.y != mon->my);
		obj_gone = thitmonst(mon, obj, ostack);
		/* Monster may have been tamed; this frees old mon */
		mon = m_at(level, bhitpos.x, bhitpos.y);

		/* [perhaps this should be moved into thitmonst or hmon] */
		if (mon && mon->isshk &&
			(!inside_shop(level, u.ux, u.uy) ||
			 !strchr(in_rooms(level, mon->mx, mon->my, SHOPBASE), *u.ushops)))
		    hot_pursuit(mon);

		if (obj_gone) return;
	}

	if (u.uswallow) {
		/* ball is not picked up by monster */
		if (obj != uball) mpickobj(u.ustuck,obj);
	} else {
		/* the code following might become part of dropy() */
		if (obj->oartifact == ART_MJOLLNIR &&
			Role_if (PM_VALKYRIE) && rn2(100)) {
		    /* we must be wearing Gauntlets of Power to get here */
		    sho_obj_return_to_u(obj, dx, dy);	    /* display its flight */

		    if (!impaired && rn2(100)) {
			pline("%s to your hand!", Tobjnam(obj, "return"));
			obj = addinv(obj);
			encumber_msg();
			setuwep(obj);
			u.twoweap = twoweap;
			if (cansee(bhitpos.x, bhitpos.y))
			    newsym(bhitpos.x,bhitpos.y);
		    } else {
			int dmg = rn2(2);
			if (!dmg) {
			    pline(Blind ? "%s lands %s your %s." :
					"%s back to you, landing %s your %s.",
				  Blind ? "Something" : Tobjnam(obj, "return"),
				  Levitation ? "beneath" : "at",
				  makeplural(body_part(FOOT)));
			} else {
			    dmg += rnd(3);
			    pline(Blind ? "%s your %s!" :
					"%s back toward you, hitting your %s!",
				  Tobjnam(obj, Blind ? "hit" : "fly"),
				  body_part(ARM));
			    artifact_hit(NULL, &youmonst, obj, ostack, TRUE,
					 &dmg, 0);
			    losehp(dmg, xname(obj),
				obj_is_pname(obj) ? KILLED_BY : KILLED_BY_AN);
			}
			if (ship_object(obj, u.ux, u.uy, FALSE)) {
		    	    thrownobj = NULL;
			    return;
			}
			dropy(obj);
		    }
		    thrownobj = NULL;
		    return;
		}

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ) &&
			breaktest(obj)) {
		    tmp_at(DISP_OBJECT, dbuf_objid(obj));
		    tmp_at(bhitpos.x, bhitpos.y);
		    win_delay_output();
		    tmp_at(DISP_END, 0);
		    breakmsg(obj, cansee(bhitpos.x, bhitpos.y));
		    breakobj(obj, bhitpos.x, bhitpos.y, TRUE, TRUE);
		    return;
		}
		if (flooreffects(obj,bhitpos.x,bhitpos.y,"fall")) return;
		obj_no_longer_held(obj);
		if (detonate_obj(obj, ostack, uwep, bhitpos.x, bhitpos.y, TRUE))
		    return;
		if (mon && mon->isshk && is_pick(obj)) {
		    if (cansee(bhitpos.x, bhitpos.y))
			pline("%s snatches up %s.",
			      Monnam(mon), the(xname(obj)));
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);
		    mpickobj(mon, obj);	/* may merge and free obj */
		    thrownobj = NULL;
		    return;
		}
		snuff_candle(obj);
		if (!mon && ship_object(obj, bhitpos.x, bhitpos.y, FALSE)) {
		    thrownobj = NULL;
		    return;
		}
		thrownobj = NULL;
		place_object(obj, level, bhitpos.x, bhitpos.y);
		if (*u.ushops && obj != uball)
		    check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);

		stackobj(obj);
		if (obj == uball)
		    drop_ball(bhitpos.x, bhitpos.y, dx, dy);
		if (cansee(bhitpos.x, bhitpos.y))
		    newsym(bhitpos.x,bhitpos.y);
		if (obj_sheds_light(obj))
		    vision_full_recalc = 1;

		/* Lead autoexplore back over thrown object if it's seen again.
		 * Technically the player may not see where it lands, but they
		 * could probably guess it anyway. */
		level->locations[bhitpos.x][bhitpos.y].mem_stepped = 0;

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ))
		    container_impact_dmg(obj);
	}
}